

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-hand-collator.cpp
# Opt level: O3

void __thiscall
mahjong::WiningHandCollator::backtrackTripletOrQuad
          (WiningHandCollator *this,WiningHand *extended_hand,TileHolder *extended_holder)

{
  bool bVar1;
  Meld meld;
  Meld local_40;
  
  TileHolder::popTripletOrQuadWithFrontTile(&local_40,extended_holder);
  bVar1 = Meld::isValid(&local_40);
  if ((bVar1) &&
     ((ulong)(((long)(extended_hand->pairs).
                     super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(extended_hand->pairs).
                     super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2)) {
    std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::push_back
              (&extended_hand->melds,&local_40);
    backtrack(this,extended_hand,extended_holder);
  }
  if (local_40.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WiningHandCollator::backtrackTripletOrQuad(WiningHand extended_hand, TileHolder extended_holder)
{
	auto meld = extended_holder.popTripletOrQuadWithFrontTile();
	if (meld.isValid() && extended_hand.pairs.size() < 2)
	{
		extended_hand.melds.push_back(meld);
		backtrack(extended_hand, extended_holder);
	}
}